

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O1

void gen_vmrglw(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if (ctx->altivec_enabled != false) {
    s = ctx->uc->tcg_ctx;
    uVar1 = ctx->opcode;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 0xc & 0x1f0) + 0x12d20);
    uVar1 = ctx->opcode;
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts_00 - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 7 & 0x1f0) + 0x12d20);
    uVar1 = ctx->opcode;
    ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_ppc64
              (s,(TCGv_i64)((long)ts_01 - (long)s),(TCGv_i64)s->cpu_env,
               (ulong)(uVar1 >> 0x11 & 0x1f0) + 0x12d20);
    local_48 = ts_01;
    local_40 = ts;
    local_38 = ts_00;
    tcg_gen_callN_ppc64(s,helper_vmrglw_ppc64,(TCGTemp *)0x0,3,&local_48);
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ts_00);
    tcg_temp_free_internal_ppc64(s,ts_01);
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void trans_vmrgew(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int VT = rD(ctx->opcode);
    int VA = rA(ctx->opcode);
    int VB = rB(ctx->opcode);
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 avr = tcg_temp_new_i64(tcg_ctx);

    get_avr64(tcg_ctx, avr, VB, true);
    tcg_gen_shri_i64(tcg_ctx, tmp, avr, 32);
    get_avr64(tcg_ctx, avr, VA, true);
    tcg_gen_deposit_i64(tcg_ctx, avr, avr, tmp, 0, 32);
    set_avr64(tcg_ctx, VT, avr, true);

    get_avr64(tcg_ctx, avr, VB, false);
    tcg_gen_shri_i64(tcg_ctx, tmp, avr, 32);
    get_avr64(tcg_ctx, avr, VA, false);
    tcg_gen_deposit_i64(tcg_ctx, avr, avr, tmp, 0, 32);
    set_avr64(tcg_ctx, VT, avr, false);

    tcg_temp_free_i64(tcg_ctx, tmp);
    tcg_temp_free_i64(tcg_ctx, avr);
}